

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall
iqxmlrpc::http::Header::register_validator
          (Header *this,string *name,Option_validator_fn *fn,Verification_level level)

{
  Option_validator v;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>
  pStack_88;
  Option_validator local_40;
  
  local_40.level = level;
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_40.fn.
               super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ,&fn->
                super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             );
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>
  ::pair<iqxmlrpc::http::Header::Option_validator_&,_true>(&pStack_88,name,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>,std::_Select1st<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>>
  ::_M_emplace_equal<std::pair<std::__cxx11::string,iqxmlrpc::http::Header::Option_validator>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>,std::_Select1st<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,iqxmlrpc::http::Header::Option_validator>>>
              *)&this->validators_,&pStack_88);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::http::Header::Option_validator>
  ::~pair(&pStack_88);
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_40.fn.
                super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              );
  return;
}

Assistant:

void Header::register_validator(
  const std::string& name,
  Header::Option_validator_fn fn,
  Verification_level level)
{
  Option_validator v = { level, fn };
  validators_.insert(std::make_pair(name, v));
}